

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRNetClient.cpp
# Opt level: O0

VRDataQueue * __thiscall
MinVR::VRNetClient::syncEventDataAcrossAllNodes(VRNetClient *this,VRDataQueue *eventQueue)

{
  VRDataQueue *in_RDI;
  serialData allEventData;
  VRDataQueue *in_stack_000003b8;
  serialData *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff8c;
  string local_68 [48];
  string local_38 [56];
  
  VRDataQueue::serialize_abi_cxx11_(in_stack_000003b8);
  VRNetInterface::sendEventData(in_stack_ffffffffffffff84,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_38);
  VRNetInterface::waitForAndReceiveEventData_abi_cxx11_(in_stack_ffffffffffffff8c);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff78,local_68);
  VRDataQueue::VRDataQueue
            ((VRDataQueue *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff78);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  std::__cxx11::string::~string(local_68);
  return in_RDI;
}

Assistant:

VRDataQueue VRNetClient::syncEventDataAcrossAllNodes(VRDataQueue eventQueue) {

  // 1. send inputEvents to server
  sendEventData(_socketFD, eventQueue.serialize());

  // 2. receive all events from the server
  VRDataQueue::serialData allEventData = waitForAndReceiveEventData(_socketFD);

  return VRDataQueue(allEventData);
}